

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<float>::Subst_Forward(TPZMatrix<float> *this,TPZFMatrix<float> *B)

{
  TPZBaseMatrix *pTVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  float fVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  int64_t i;
  float sum;
  int64_t c;
  float pivot;
  int64_t r;
  float local_44;
  long local_40;
  float local_34;
  long local_30;
  float local_24;
  long local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  lVar3 = (**(code **)(*in_RDI + 0x60))();
  if (((iVar2 == lVar3) && ((char)in_RDI[3] != '\0')) && ((char)in_RDI[3] == '\x03')) {
    local_20 = 0;
    while( true ) {
      lVar3 = local_20;
      lVar4 = (**(code **)(*in_RDI + 0x60))();
      if (lVar4 <= lVar3) break;
      local_24 = (float)(**(code **)(*in_RDI + 0x120))(in_RDI,local_20,local_20);
      local_30 = 0;
      while( true ) {
        lVar3 = local_30;
        iVar2 = TPZBaseMatrix::Cols(local_18);
        if (iVar2 <= lVar3) break;
        local_34 = 0.0;
        for (local_40 = 0; pTVar1 = local_18, lVar4 = local_20, lVar3 = local_30,
            local_40 < local_20; local_40 = local_40 + 1) {
          fVar5 = (float)(**(code **)(*in_RDI + 0x120))(in_RDI,local_20,local_40);
          (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_40,local_30);
          local_34 = fVar5 * extraout_XMM0_Da + local_34;
        }
        (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_20,local_30);
        local_44 = (extraout_XMM0_Da_00 - local_34) / local_24;
        (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar1,lVar4,lVar3,&local_44);
        local_30 = local_30 + 1;
      }
      local_20 = local_20 + 1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}